

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcFlowMeterType::IfcFlowMeterType(IfcFlowMeterType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcFlowMeterType";
  Schema_2x3::IfcFlowControllerType::IfcFlowControllerType
            (&this->super_IfcFlowControllerType,&PTR_construction_vtable_24__007ccd98);
  *(undefined8 *)&(this->super_IfcFlowControllerType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x7ccc18;
  *(undefined8 *)&this->field_0x1e0 = 0x7ccd80;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x7ccc40;
  (this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7ccc68;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x7ccc90;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x7cccb8;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x7ccce0;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x7ccd08;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x7ccd30;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.field_0x1b0 = 0x7ccd58;
  *(undefined1 **)&(this->super_IfcFlowControllerType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcFlowMeterType() : Object("IfcFlowMeterType") {}